

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>::
fulfill(AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>
        *this,unsigned_long *value)

{
  unsigned_long *value_00;
  ExceptionOr<unsigned_long> local_1c0;
  unsigned_long *local_18;
  unsigned_long *value_local;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (unsigned_long *)this;
    value_00 = mv<unsigned_long>(value);
    ExceptionOr<unsigned_long>::ExceptionOr(&local_1c0,value_00);
    ExceptionOr<unsigned_long>::operator=(&this->result,&local_1c0);
    ExceptionOr<unsigned_long>::~ExceptionOr(&local_1c0);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }